

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

void bgr_888_to_rgba_5551
               (void *src,int src_pitch,void *dst,int dst_pitch,int sx,int sy,int dx,int dy,
               int width,int height)

{
  ushort *puVar1;
  ushort *puVar2;
  byte *pbVar3;
  int iVar4;
  
  if (0 < height) {
    puVar2 = (ushort *)((long)dst + (long)dx * 2 + (long)(dy * dst_pitch));
    pbVar3 = (byte *)((long)src + (long)(sy * src_pitch) + (long)(sx * 3));
    iVar4 = 0;
    do {
      if (0 < width) {
        puVar1 = puVar2 + width;
        do {
          *puVar2 = (*pbVar3 & 0xfff8) << 8 | (ushort)(pbVar3[2] >> 2) + (pbVar3[1] & 0xf8) * 8 | 1;
          pbVar3 = pbVar3 + 3;
          puVar2 = puVar2 + 1;
        } while (puVar2 < puVar1);
      }
      pbVar3 = pbVar3 + (src_pitch + width * -3);
      puVar2 = puVar2 + (dst_pitch / 2 - width);
      iVar4 = iVar4 + 1;
    } while (iVar4 != height);
  }
  return;
}

Assistant:

static void bgr_888_to_rgba_5551(const void *src, int src_pitch,
   void *dst, int dst_pitch,
   int sx, int sy, int dx, int dy, int width, int height)
{
   int y;
   const uint8_t *src_ptr = (const uint8_t *)((const char *)src + sy * src_pitch);
   uint16_t *dst_ptr = (void *)((char *)dst + dy * dst_pitch);
   int src_gap = src_pitch / 1 - width * 3;
   int dst_gap = dst_pitch / 2 - width;
   src_ptr += sx * 3;
   dst_ptr += dx;
   for (y = 0; y < height; y++) {
      uint16_t *dst_end = dst_ptr + width;
      while (dst_ptr < dst_end) {
         #ifdef ALLEGRO_BIG_ENDIAN
         int src_pixel = src_ptr[2] | (src_ptr[1] << 8) | (src_ptr[0] << 16);
         #else
         int src_pixel = src_ptr[0] | (src_ptr[1] << 8) | (src_ptr[2] << 16);
         #endif
         *dst_ptr = ALLEGRO_CONVERT_BGR_888_TO_RGBA_5551(src_pixel);
         src_ptr += 1 * 3;
         dst_ptr += 1;
      }
      src_ptr += src_gap;
      dst_ptr += dst_gap;
   }
}